

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O3

void __thiscall soul::RenderingVenue::Pimpl::SessionImpl::~SessionImpl(SessionImpl *this)

{
  _Manager_type p_Var1;
  Performer *pPVar2;
  
  (this->super_Session)._vptr_Session = (_func_int **)&PTR__SessionImpl_002d0958;
  TaskThread::removeQueue((this->taskQueue).ownerThread,&this->taskQueue);
  removeActiveSession(this->venue,this);
  p_Var1 = (this->postRenderCallback).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->postRenderCallback,(_Any_data *)&this->postRenderCallback,
              __destroy_functor);
  }
  p_Var1 = (this->preRenderCallback).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->preRenderCallback,(_Any_data *)&this->preRenderCallback,
              __destroy_functor);
  }
  p_Var1 = (this->getBlockSizeCallback).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->getBlockSizeCallback,(_Any_data *)&this->getBlockSizeCallback,
              __destroy_functor);
  }
  p_Var1 = (this->beginNextBlockCallback).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->beginNextBlockCallback,(_Any_data *)&this->beginNextBlockCallback,
              __destroy_functor);
  }
  pPVar2 = (this->performer)._M_t.
           super___uniq_ptr_impl<soul::Performer,_std::default_delete<soul::Performer>_>._M_t.
           super__Tuple_impl<0UL,_soul::Performer_*,_std::default_delete<soul::Performer>_>.
           super__Head_base<0UL,_soul::Performer_*,_false>._M_head_impl;
  if (pPVar2 != (Performer *)0x0) {
    (**(code **)(*(long *)pPVar2 + 8))();
  }
  (this->performer)._M_t.
  super___uniq_ptr_impl<soul::Performer,_std::default_delete<soul::Performer>_>._M_t.
  super__Tuple_impl<0UL,_soul::Performer_*,_std::default_delete<soul::Performer>_>.
  super__Head_base<0UL,_soul::Performer_*,_false>._M_head_impl = (Performer *)0x0;
  std::
  vector<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>,_std::allocator<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>_>_>
  ::~vector(&(this->taskQueue).tasks);
  return;
}

Assistant:

~SessionImpl() override
        {
            taskQueue.detach();
            venue.removeActiveSession (*this);
        }